

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.cpp
# Opt level: O1

vector<TCacheReq,_std::allocator<TCacheReq>_> *
RandomAssignment(vector<TCacheReq,_std::allocator<TCacheReq>_> *__return_storage_ptr__,TProblem *p)

{
  pointer *ppTVar1;
  __node_base_ptr p_Var2;
  _Hash_node_base *p_Var3;
  unsigned_long uVar4;
  iterator __position;
  bool bVar5;
  size_t __i;
  long lVar6;
  __node_base_ptr p_Var7;
  ulong uVar8;
  __hash_code __code;
  ulong uVar9;
  __node_base_ptr p_Var10;
  size_t sVar11;
  vector<TCacheReq,_std::allocator<TCacheReq>_> *reqs;
  result_type videoId;
  uniform_int_distribution<unsigned_long> randomVideo;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  selected;
  mt19937 rng;
  size_t local_1420;
  TCacheReq local_1418;
  _Hash_node_base *local_1408;
  uniform_int_distribution<unsigned_long> local_1400;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_13f0;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13b8;
  
  local_13b8._M_x[0] = 0x1571;
  lVar6 = 1;
  uVar9 = 0x1571;
  do {
    uVar9 = (ulong)(((uint)(uVar9 >> 0x1e) ^ (uint)uVar9) * 0x6c078965 + (int)lVar6);
    local_13b8._M_x[lVar6] = uVar9;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x270);
  local_13b8._M_p = 0x270;
  local_1400._M_param._M_b =
       ((long)(p->Vides).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(p->Vides).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start >> 3) - 1;
  local_1400._M_param._M_a = 0;
  (__return_storage_ptr__->super__Vector_base<TCacheReq,_std::allocator<TCacheReq>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<TCacheReq,_std::allocator<TCacheReq>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<TCacheReq,_std::allocator<TCacheReq>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (p->CacheCount != 0) {
    local_1420 = 0;
    do {
      local_13f0._M_buckets = &local_13f0._M_single_bucket;
      local_13f0._M_bucket_count = 1;
      local_13f0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_13f0._M_element_count = 0;
      local_13f0._M_rehash_policy._M_max_load_factor = 1.0;
      local_13f0._M_rehash_policy._M_next_resize = 0;
      local_13f0._M_single_bucket = (__node_base_ptr)0x0;
      sVar11 = p->CacheSize;
      do {
        if (local_13f0._M_element_count ==
            (long)(p->Vides).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(p->Vides).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3) break;
        local_1408 = (_Hash_node_base *)
                     std::uniform_int_distribution<unsigned_long>::operator()
                               (&local_1400,&local_13b8,&local_1400._M_param);
        uVar9 = (p->Vides).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                .super__Vector_impl_data._M_start[(long)local_1408];
        uVar8 = sVar11;
        if (uVar9 <= sVar11) {
          p_Var2 = local_13f0._M_buckets[(ulong)local_1408 % local_13f0._M_bucket_count];
          p_Var7 = (__node_base_ptr)0x0;
          if ((p_Var2 != (__node_base_ptr)0x0) &&
             (p_Var7 = p_Var2, p_Var10 = p_Var2->_M_nxt, local_1408 != p_Var2->_M_nxt[1]._M_nxt)) {
            while (p_Var3 = p_Var10->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
              p_Var7 = (__node_base_ptr)0x0;
              if (((ulong)p_Var3[1]._M_nxt % local_13f0._M_bucket_count !=
                   (ulong)local_1408 % local_13f0._M_bucket_count) ||
                 (p_Var7 = p_Var10, p_Var10 = p_Var3, local_1408 == p_Var3[1]._M_nxt))
              goto LAB_00102af2;
            }
            p_Var7 = (__node_base_ptr)0x0;
          }
LAB_00102af2:
          if ((p_Var7 == (__node_base_ptr)0x0) || (p_Var7->_M_nxt == (_Hash_node_base *)0x0)) {
            local_1418.ServerId = (size_t)&local_13f0;
            std::
            _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_insert<unsigned_long_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                      ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)local_1418.ServerId,&local_1408,&local_1418);
            uVar4 = (p->Vides).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start[(long)local_1408];
            local_1418.ServerId = local_1420;
            local_1418.VideoId = (size_t)local_1408;
            __position._M_current =
                 (__return_storage_ptr__->super__Vector_base<TCacheReq,_std::allocator<TCacheReq>_>)
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (__return_storage_ptr__->super__Vector_base<TCacheReq,_std::allocator<TCacheReq>_>).
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<TCacheReq,_std::allocator<TCacheReq>_>::_M_realloc_insert<TCacheReq>
                        (__return_storage_ptr__,__position,&local_1418);
            }
            else {
              (__position._M_current)->ServerId = local_1420;
              (__position._M_current)->VideoId = (size_t)local_1408;
              ppTVar1 = &(__return_storage_ptr__->
                         super__Vector_base<TCacheReq,_std::allocator<TCacheReq>_>)._M_impl.
                         super__Vector_impl_data._M_finish;
              *ppTVar1 = *ppTVar1 + 1;
            }
            uVar8 = sVar11 - uVar4;
          }
        }
        bVar5 = uVar9 <= sVar11;
        sVar11 = uVar8;
      } while (bVar5);
      std::
      _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&local_13f0);
      local_1420 = local_1420 + 1;
    } while (local_1420 < p->CacheCount);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<TCacheReq> RandomAssignment(const TProblem& p) {
    std::mt19937 rng;
    std::uniform_int_distribution<size_t> randomVideo(0, p.Vides.size() - 1);

    std::vector<TCacheReq> reqs;

    for (size_t i = 0; i < p.CacheCount; ++i) {
        std::unordered_set<size_t> selected;

        size_t capacity = p.CacheSize;
        while (true) {
            if (selected.size() == p.Vides.size()) {
                break;
            }

            auto videoId = randomVideo(rng);
            if (p.Vides[videoId] > capacity) {
                break;
            }

            if (selected.find(videoId) != selected.end()) {
                continue;
            }

            selected.insert(videoId);
            capacity -= p.Vides[videoId];

            reqs.emplace_back(TCacheReq{i, videoId});
        }
    }

    return reqs;
}